

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::setRange(Stepper *this,int min,int max)

{
  StepperPrivate *this_00;
  int iVar1;
  int iVar2;
  
  iVar1 = max;
  if (min < max) {
    iVar1 = min;
  }
  this_00 = (this->d).d;
  this_00->minimum = iVar1;
  if (min < max) {
    min = max;
  }
  this_00->maximum = min;
  iVar1 = this_00->value;
  iVar2 = StepperPrivate::bound(this_00,iVar1);
  this_00->value = iVar2;
  StepperPrivate::enableButtons(this_00);
  iVar2 = ((this->d).d)->value;
  if (iVar2 == iVar1) {
    return;
  }
  valueChanged(this,iVar2);
  return;
}

Assistant:

void
Stepper::setRange( int min, int max )
{
	d->minimum = min < max ? min : max;
	d->maximum = max < min ? min : max;

	const int oldValue = d->value;

	d->value = d->bound( d->value );

	d->enableButtons();

	if( d->value != oldValue )
		emit valueChanged( d->value );
}